

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

void __thiscall
rangeless::fn::impl::
maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
::maybe(maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
        *this,maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
              *other)

{
  this->m_empty = true;
  if (other->m_empty == false) {
    *(undefined1 *)((long)&this->field_0 + 4) = 1;
    if (*(char *)((long)&other->field_0 + 4) == '\0') {
      (this->field_0).m_value.m_current.field_0 = (other->field_0).m_value.m_current.field_0;
      *(undefined1 *)((long)&this->field_0 + 4) = 0;
      if (*(char *)((long)&other->field_0 + 4) == '\0') {
        *(undefined1 *)((long)&other->field_0 + 4) = 1;
      }
    }
    *(undefined4 *)((long)&this->field_0 + 0xf) = *(undefined4 *)((long)&other->field_0 + 0xf);
    (this->field_0).m_value.m_gen.parent = (other->field_0).m_value.m_gen.parent;
    this->m_empty = false;
    if (other->m_empty == false) {
      if (*(char *)((long)&other->field_0 + 4) == '\0') {
        *(undefined1 *)((long)&other->field_0 + 4) = 1;
      }
      other->m_empty = true;
    }
  }
  return;
}

Assistant:

maybe(maybe&& other) noexcept
        {        //^^ by value instead?
            if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            }
        }